

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Install
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  cmake *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  pointer pcVar4;
  string *psVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  bool local_751;
  byte local_6d9;
  allocator<char> local_619;
  value_type local_618;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5f0;
  const_iterator local_5e8;
  undefined1 local_5e0 [8];
  cmCustomCommandLine stripCmdLine;
  string local_5c0;
  char *local_5a0;
  char *install_strip;
  allocator<char> local_589;
  value_type local_588;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_568;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_560;
  const_iterator local_558;
  undefined1 local_550 [8];
  cmCustomCommandLine localCmdLine;
  char *install_local;
  value_type local_528;
  allocator<char> local_501;
  value_type local_500;
  allocator<char> local_4d9;
  string local_4d8;
  cmValue local_4b8;
  byte local_4aa;
  allocator<char> local_4a9;
  undefined1 local_4a8 [6];
  bool useEPN;
  string cfgArg;
  string local_480;
  allocator<char> local_459;
  string local_458;
  cmValue local_438;
  char *local_430;
  string *local_428;
  allocator<char> local_419;
  string local_418;
  cmValue local_3f8;
  cmValue noall;
  undefined1 local_3e8 [8];
  cmCustomCommandLine singleLine;
  GlobalTargetInfo gti;
  string cmd;
  undefined1 local_2f0 [8];
  GlobalTargetInfo gti_1;
  string local_240;
  undefined1 local_220 [8];
  ostringstream ostr;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *componentsSet;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_29;
  char *pcStack_28;
  bool skipInstallRules;
  char *cmakeCfgIntDir;
  value_type *mf;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *targets_local;
  cmGlobalGenerator *this_local;
  
  mf = (value_type *)targets;
  targets_local =
       (vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        *)this;
  cmakeCfgIntDir =
       (char *)std::
               vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
               ::operator[](&this->Makefiles,0);
  iVar2 = (*this->_vptr_cmGlobalGenerator[0x15])();
  pcStack_28 = (char *)CONCAT44(extraout_var,iVar2);
  pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)cmakeCfgIntDir);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_SKIP_INSTALL_RULES",&local_51);
  bVar1 = cmMakefile::IsOn(pcVar4,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_29 = bVar1;
  if (((this->InstallTargetEnabled & 1U) == 0) || (!bVar1)) {
    if (((this->InstallTargetEnabled & 1U) != 0) && (!bVar1)) {
      bVar1 = cmNonempty(pcStack_28);
      if ((!bVar1) || (*pcStack_28 == '.')) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
        bVar1 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->InstallComponents);
        if (bVar1) {
          std::operator<<((ostream *)local_220,"Only default component available");
        }
        else {
          std::operator<<((ostream *)local_220,"Available install components are: ");
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&gti_1.StdPipesUTF8," ");
          cmWrap<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    (&local_240,'\"',&this->InstallComponents,'\"',stack0xfffffffffffffdb0);
          std::operator<<((ostream *)local_220,(string *)&local_240);
          std::__cxx11::string::~string((string *)&local_240);
        }
        GlobalTargetInfo::GlobalTargetInfo((GlobalTargetInfo *)local_2f0);
        std::__cxx11::string::operator=((string *)local_2f0,"list_install_components");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=
                  ((string *)(gti_1.Name.field_2._M_local_buf + 8),
                   (string *)(cmd.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(cmd.field_2._M_local_buf + 8));
        gti_1.WorkingDir.field_2._M_local_buf[8] = '\0';
        std::
        vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        ::push_back((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                     *)mf,(value_type *)local_2f0);
        GlobalTargetInfo::~GlobalTargetInfo((GlobalTargetInfo *)local_2f0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
      }
      psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      std::__cxx11::string::string((string *)&gti.StdPipesUTF8,(string *)psVar5);
      GlobalTargetInfo::GlobalTargetInfo
                ((GlobalTargetInfo *)
                 &singleLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar2 = (*this->_vptr_cmGlobalGenerator[0x1a])();
      std::__cxx11::string::operator=
                ((string *)
                 &singleLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (char *)CONCAT44(extraout_var_00,iVar2));
      std::__cxx11::string::operator=
                ((string *)(gti.Name.field_2._M_local_buf + 8),"Install the project...");
      gti.WorkingDir.field_2._M_local_buf[8] = '\x01';
      gti.UsesTerminal = true;
      cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_3e8);
      iVar2 = (*this->_vptr_cmGlobalGenerator[0x1d])();
      if (CONCAT44(extraout_var_01,iVar2) == 0) {
        pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                           ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                            cmakeCfgIntDir);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"CMAKE_SKIP_INSTALL_ALL_DEPENDENCY",&local_419);
        local_3f8 = cmMakefile::GetDefinition(pcVar4,&local_418);
        std::__cxx11::string::~string((string *)&local_418);
        std::allocator<char>::~allocator(&local_419);
        local_428 = local_3f8.Value;
        bVar1 = cmIsOff(local_3f8);
        if (bVar1) {
          iVar2 = (*this->_vptr_cmGlobalGenerator[0x19])();
          local_430 = (char *)CONCAT44(extraout_var_03,iVar2);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &gti.CommandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&local_430);
        }
      }
      else {
        iVar2 = (*this->_vptr_cmGlobalGenerator[0x1d])();
        noall.Value = (string *)CONCAT44(extraout_var_02,iVar2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &gti.CommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(char **)&noall);
      }
      pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                         ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)cmakeCfgIntDir
                         );
      std::allocator<char>::allocator();
      cfgArg.field_2._M_local_buf[0xe] = '\0';
      cfgArg.field_2._M_local_buf[0xd] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,"CMake_BINARY_DIR",&local_459);
      local_438 = cmMakefile::GetDefinition(pcVar4,&local_458);
      bVar1 = cmValue::operator_cast_to_bool(&local_438);
      local_6d9 = 0;
      if (bVar1) {
        pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                           ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                            cmakeCfgIntDir);
        std::allocator<char>::allocator();
        cfgArg.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_480,"CMAKE_CROSSCOMPILING",
                   (allocator<char> *)(cfgArg.field_2._M_local_buf + 0xf));
        cfgArg.field_2._M_local_buf[0xd] = '\x01';
        bVar1 = cmMakefile::IsOn(pcVar4,&local_480);
        local_6d9 = bVar1 ^ 0xff;
      }
      if ((cfgArg.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_480);
      }
      if ((cfgArg.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(cfgArg.field_2._M_local_buf + 0xf));
      }
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator(&local_459);
      if ((local_6d9 & 1) != 0) {
        std::__cxx11::string::operator=((string *)&gti.StdPipesUTF8,"cmake");
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3e8,(value_type *)&gti.StdPipesUTF8);
      bVar1 = cmNonempty(pcStack_28);
      if ((bVar1) && (*pcStack_28 != '.')) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_4a8,"-DBUILD_TYPE=",&local_4a9);
        std::allocator<char>::~allocator(&local_4a9);
        pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get
                           ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                            cmakeCfgIntDir);
        uVar3 = (*this->_vptr_cmGlobalGenerator[0x2f])(this,pcVar4);
        local_4aa = (byte)uVar3 & 1;
        if ((uVar3 & 1) == 0) {
          pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                             ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                              cmakeCfgIntDir);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4d8,"CMAKE_CFG_INTDIR",&local_4d9);
          local_4b8 = cmMakefile::GetDefinition(pcVar4,&local_4d8);
          psVar5 = cmValue::operator*[abi_cxx11_(&local_4b8);
          std::__cxx11::string::operator+=((string *)local_4a8,(string *)psVar5);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::allocator<char>::~allocator(&local_4d9);
        }
        else {
          std::__cxx11::string::operator+=((string *)local_4a8,"$(CONFIGURATION)");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3e8,(value_type *)local_4a8);
          std::__cxx11::string::operator=
                    ((string *)local_4a8,"-DEFFECTIVE_PLATFORM_NAME=$(EFFECTIVE_PLATFORM_NAME)");
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_3e8,(value_type *)local_4a8);
        std::__cxx11::string::~string((string *)local_4a8);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"-P",&local_501);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3e8,&local_500);
      std::__cxx11::string::~string((string *)&local_500);
      std::allocator<char>::~allocator(&local_501);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_528,"cmake_install.cmake",
                 (allocator<char> *)((long)&install_local + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3e8,&local_528);
      std::__cxx11::string::~string((string *)&local_528);
      std::allocator<char>::~allocator((allocator<char> *)((long)&install_local + 7));
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                 ((long)&gti.Message.field_2 + 8),(value_type *)local_3e8);
      std::
      vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
      ::push_back((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                   *)mf,(value_type *)
                        &singleLine.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar2 = (*this->_vptr_cmGlobalGenerator[0x1b])();
      localCmdLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var_04,iVar2);
      if (localCmdLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        std::__cxx11::string::operator=
                  ((string *)
                   &singleLine.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (char *)localCmdLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator=
                  ((string *)(gti.Name.field_2._M_local_buf + 8),
                   "Installing only the local directory...");
        gti.WorkingDir.field_2._M_local_buf[8] = '\x01';
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::clear
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   ((long)&gti.Message.field_2 + 8));
        cmCustomCommandLine::cmCustomCommandLine
                  ((cmCustomCommandLine *)local_550,(cmCustomCommandLine *)local_3e8);
        local_568._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_550);
        local_560 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator+(&local_568,1);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_558,&local_560);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_588,"-DCMAKE_INSTALL_LOCAL_ONLY=1",&local_589);
        install_strip =
             (char *)std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_550,local_558,&local_588);
        std::__cxx11::string::~string((string *)&local_588);
        std::allocator<char>::~allocator(&local_589);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   ((long)&gti.Message.field_2 + 8),(value_type *)local_550);
        std::
        vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        ::push_back((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                     *)mf,(value_type *)
                          &singleLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_550);
      }
      iVar2 = (*this->_vptr_cmGlobalGenerator[0x1c])();
      local_5a0 = (char *)CONCAT44(extraout_var_05,iVar2);
      stripCmdLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      stripCmdLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      local_751 = false;
      if (local_5a0 != (char *)0x0) {
        pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                           ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                            cmakeCfgIntDir);
        std::allocator<char>::allocator();
        stripCmdLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5c0,"CMAKE_STRIP",
                   (allocator<char> *)
                   ((long)&stripCmdLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        stripCmdLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
        local_751 = cmMakefile::IsSet(pcVar4,&local_5c0);
      }
      if ((stripCmdLine.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_5c0);
      }
      if ((stripCmdLine.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&stripCmdLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      if (local_751 != false) {
        std::__cxx11::string::operator=
                  ((string *)
                   &singleLine.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_5a0);
        std::__cxx11::string::operator=
                  ((string *)(gti.Name.field_2._M_local_buf + 8),
                   "Installing the project stripped...");
        gti.WorkingDir.field_2._M_local_buf[8] = '\x01';
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::clear
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   ((long)&gti.Message.field_2 + 8));
        cmCustomCommandLine::cmCustomCommandLine
                  ((cmCustomCommandLine *)local_5e0,(cmCustomCommandLine *)local_3e8);
        local_5f8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_5e0);
        local_5f0 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator+(&local_5f8,1);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_5e8,&local_5f0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_618,"-DCMAKE_INSTALL_DO_STRIP=1",&local_619);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5e0,local_5e8,&local_618);
        std::__cxx11::string::~string((string *)&local_618);
        std::allocator<char>::~allocator(&local_619);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   ((long)&gti.Message.field_2 + 8),(value_type *)local_5e0);
        std::
        vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        ::push_back((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                     *)mf,(value_type *)
                          &singleLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_5e0);
      }
      cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_3e8);
      GlobalTargetInfo::~GlobalTargetInfo
                ((GlobalTargetInfo *)
                 &singleLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&gti.StdPipesUTF8);
    }
  }
  else {
    this_00 = this->CMakeInstance;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               "CMAKE_SKIP_INSTALL_RULES was enabled even though installation rules have been specified"
               ,&local_89);
    std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
              ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)cmakeCfgIntDir);
    cmMakefile::GetBacktrace((cmMakefile *)&componentsSet);
    cmake::IssueMessage(this_00,WARNING,&local_88,(cmListFileBacktrace *)&componentsSet);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&componentsSet);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Install(
  std::vector<GlobalTargetInfo>& targets)
{
  auto& mf = this->Makefiles[0];
  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  bool skipInstallRules = mf->IsOn("CMAKE_SKIP_INSTALL_RULES");
  if (this->InstallTargetEnabled && skipInstallRules) {
    this->CMakeInstance->IssueMessage(
      MessageType::WARNING,
      "CMAKE_SKIP_INSTALL_RULES was enabled even though "
      "installation rules have been specified",
      mf->GetBacktrace());
  } else if (this->InstallTargetEnabled && !skipInstallRules) {
    if (!(cmNonempty(cmakeCfgIntDir) && cmakeCfgIntDir[0] != '.')) {
      std::set<std::string>* componentsSet = &this->InstallComponents;
      std::ostringstream ostr;
      if (!componentsSet->empty()) {
        ostr << "Available install components are: ";
        ostr << cmWrap('"', *componentsSet, '"', " ");
      } else {
        ostr << "Only default component available";
      }
      GlobalTargetInfo gti;
      gti.Name = "list_install_components";
      gti.Message = ostr.str();
      gti.UsesTerminal = false;
      targets.push_back(std::move(gti));
    }
    std::string cmd = cmSystemTools::GetCMakeCommand();
    GlobalTargetInfo gti;
    gti.Name = this->GetInstallTargetName();
    gti.Message = "Install the project...";
    gti.UsesTerminal = true;
    gti.StdPipesUTF8 = true;
    cmCustomCommandLine singleLine;
    if (this->GetPreinstallTargetName()) {
      gti.Depends.emplace_back(this->GetPreinstallTargetName());
    } else {
      cmValue noall = mf->GetDefinition("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY");
      if (cmIsOff(noall)) {
        gti.Depends.emplace_back(this->GetAllTargetName());
      }
    }
    if (mf->GetDefinition("CMake_BINARY_DIR") &&
        !mf->IsOn("CMAKE_CROSSCOMPILING")) {
      // We are building CMake itself.  We cannot use the original
      // executable to install over itself.  The generator will
      // automatically convert this name to the build-time location.
      cmd = "cmake";
    }
    singleLine.push_back(cmd);
    if (cmNonempty(cmakeCfgIntDir) && cmakeCfgIntDir[0] != '.') {
      std::string cfgArg = "-DBUILD_TYPE=";
      bool useEPN = this->UseEffectivePlatformName(mf.get());
      if (useEPN) {
        cfgArg += "$(CONFIGURATION)";
        singleLine.push_back(cfgArg);
        cfgArg = "-DEFFECTIVE_PLATFORM_NAME=$(EFFECTIVE_PLATFORM_NAME)";
      } else {
        cfgArg += *mf->GetDefinition("CMAKE_CFG_INTDIR");
      }
      singleLine.push_back(cfgArg);
    }
    singleLine.push_back("-P");
    singleLine.push_back("cmake_install.cmake");
    gti.CommandLines.push_back(singleLine);
    targets.push_back(gti);

    // install_local
    if (const char* install_local = this->GetInstallLocalTargetName()) {
      gti.Name = install_local;
      gti.Message = "Installing only the local directory...";
      gti.UsesTerminal = true;
      gti.CommandLines.clear();

      cmCustomCommandLine localCmdLine = singleLine;

      localCmdLine.insert(localCmdLine.begin() + 1,
                          "-DCMAKE_INSTALL_LOCAL_ONLY=1");

      gti.CommandLines.push_back(std::move(localCmdLine));
      targets.push_back(gti);
    }

    // install_strip
    const char* install_strip = this->GetInstallStripTargetName();
    if ((install_strip != nullptr) && (mf->IsSet("CMAKE_STRIP"))) {
      gti.Name = install_strip;
      gti.Message = "Installing the project stripped...";
      gti.UsesTerminal = true;
      gti.CommandLines.clear();

      cmCustomCommandLine stripCmdLine = singleLine;

      stripCmdLine.insert(stripCmdLine.begin() + 1,
                          "-DCMAKE_INSTALL_DO_STRIP=1");
      gti.CommandLines.push_back(std::move(stripCmdLine));
      targets.push_back(gti);
    }
  }
}